

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test::
~TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test
          (TEST_TestFailure_UnexpectedExceptionFailure_StandardException_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestFailure, UnexpectedExceptionFailure_StandardException)
{
    std::runtime_error e("Some error");
    UnexpectedExceptionFailure f(test, e);
#if CPPUTEST_HAVE_RTTI
    STRCMP_CONTAINS("Unexpected exception of type '", f.getMessage().asCharString());
    STRCMP_CONTAINS("runtime_error", f.getMessage().asCharString());
    STRCMP_CONTAINS("' was thrown: Some error", f.getMessage().asCharString());
#else
    FAILURE_EQUAL("Unexpected exception of unknown type was thrown.", f);
#endif
}